

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::Initialize(ImGuiContext *context)

{
  int *piVar1;
  int iVar2;
  ImGuiSettingsHandler *pIVar3;
  ImU32 IVar4;
  ImGuiSettingsHandler *__dest;
  int iVar5;
  int iVar6;
  
  if ((context->Initialized == false) && (context->SettingsLoaded != true)) {
    IVar4 = ImHashStr("Window",0,0);
    iVar6 = (context->SettingsHandlers).Size;
    iVar2 = (context->SettingsHandlers).Capacity;
    if (iVar6 == iVar2) {
      iVar6 = iVar6 + 1;
      if (iVar2 == 0) {
        iVar5 = 8;
      }
      else {
        iVar5 = iVar2 / 2 + iVar2;
      }
      if (iVar6 < iVar5) {
        iVar6 = iVar5;
      }
      if (iVar2 < iVar6) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        __dest = (ImGuiSettingsHandler *)
                 (*GImAllocatorAllocFunc)((long)iVar6 * 0x30,GImAllocatorUserData);
        pIVar3 = (context->SettingsHandlers).Data;
        if (pIVar3 != (ImGuiSettingsHandler *)0x0) {
          memcpy(__dest,pIVar3,(long)(context->SettingsHandlers).Size * 0x30);
          pIVar3 = (context->SettingsHandlers).Data;
          if ((pIVar3 != (ImGuiSettingsHandler *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
        }
        (context->SettingsHandlers).Data = __dest;
        (context->SettingsHandlers).Capacity = iVar6;
      }
    }
    pIVar3 = (context->SettingsHandlers).Data;
    iVar6 = (context->SettingsHandlers).Size;
    pIVar3[iVar6].TypeName = "Window";
    pIVar3[iVar6].TypeHash = IVar4;
    *(undefined4 *)&pIVar3[iVar6].field_0xc = 0;
    pIVar3[iVar6].ReadOpenFn = WindowSettingsHandler_ReadOpen;
    pIVar3[iVar6].ReadLineFn = WindowSettingsHandler_ReadLine;
    pIVar3[iVar6].WriteAllFn = WindowSettingsHandler_WriteAll;
    pIVar3[iVar6].UserData = (void *)0x0;
    (context->SettingsHandlers).Size = (context->SettingsHandlers).Size + 1;
    context->Initialized = true;
    return;
  }
  __assert_fail("!g.Initialized && !g.SettingsLoaded",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                ,0xf41,"void ImGui::Initialize(ImGuiContext *)");
}

Assistant:

void ImGui::Initialize(ImGuiContext* context)
{
    ImGuiContext& g = *context;
    IM_ASSERT(!g.Initialized && !g.SettingsLoaded);

    // Add .ini handle for ImGuiWindow type
    {
        ImGuiSettingsHandler ini_handler;
        ini_handler.TypeName = "Window";
        ini_handler.TypeHash = ImHashStr("Window");
        ini_handler.ReadOpenFn = WindowSettingsHandler_ReadOpen;
        ini_handler.ReadLineFn = WindowSettingsHandler_ReadLine;
        ini_handler.WriteAllFn = WindowSettingsHandler_WriteAll;
        g.SettingsHandlers.push_back(ini_handler);
    }

#ifdef IMGUI_HAS_TABLE
    // Add .ini handle for ImGuiTable type
    {
        ImGuiSettingsHandler ini_handler;
        ini_handler.TypeName = "Table";
        ini_handler.TypeHash = ImHashStr("Table");
        ini_handler.ReadOpenFn = TableSettingsHandler_ReadOpen;
        ini_handler.ReadLineFn = TableSettingsHandler_ReadLine;
        ini_handler.WriteAllFn = TableSettingsHandler_WriteAll;
        g.SettingsHandlers.push_back(ini_handler);
    }
#endif // #ifdef IMGUI_HAS_TABLE

#ifdef IMGUI_HAS_DOCK
#endif // #ifdef IMGUI_HAS_DOCK

    g.Initialized = true;
}